

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<true>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  code *pcVar1;
  Var pvVar2;
  PropertyIndex propertyIndex;
  uint uVar3;
  DynamicObject *pDVar4;
  bool bVar5;
  PropertyAttributes PVar6;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  ScriptContext *scriptContext_00;
  DynamicType *pDVar10;
  undefined4 extraout_var;
  DynamicTypeHandler *pDVar11;
  undefined4 extraout_var_00;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar12;
  uint32 local_54;
  ScriptContext *pSStack_50;
  uint32 indexVal;
  ScriptContext *scriptContext;
  PathTypeHandlerBase *pPStack_40;
  bool setAttrDone;
  PathTypeHandlerBase *newTypeHandler;
  bool isInit_local;
  Var pvStack_30;
  ObjectSlotAttributes attr_local;
  Var value_local;
  PropertyIndex index_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  newTypeHandler._6_1_ = isInit;
  pPStack_40 = (PathTypeHandlerBase *)0x0;
  newTypeHandler._7_1_ = attr;
  pvStack_30 = value;
  value_local._2_2_ = index;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  if ((value == (Var)0x0) && (BVar7 = IsInternalPropertyId(propertyId), BVar7 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar3 = value_local._4_4_;
  scriptContext_00 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(uVar3,scriptContext_00);
  if (value_local._2_2_ == 0xffff) {
    pSStack_50 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
    BVar7 = ScriptContext::IsNumericPropertyId(pSStack_50,value_local._4_4_,&local_54);
    if (BVar7 == 0) {
      this_local._4_4_ =
           AddPropertyInternal(this,pDStack_20,value_local._4_4_,pvStack_30,newTypeHandler._7_1_,
                               info,flags,possibleSideEffects);
    }
    else if (newTypeHandler._7_1_ == ObjectSlotAttr_Default) {
      this_local._4_4_ =
           DynamicTypeHandler::SetItem
                     (&this->super_DynamicTypeHandler,pDStack_20,local_54,pvStack_30,
                      PropertyOperation_None);
    }
    else {
      iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,pDStack_20);
      pDVar4 = pDStack_20;
      pvVar2 = pvStack_30;
      PVar6 = ObjectSlotAttributesToPropertyAttributes(newTypeHandler._7_1_);
      this_local._4_4_ =
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x170))
                     ((long *)CONCAT44(extraout_var_00,iVar8),pDVar4,local_54,pvVar2,PVar6);
    }
  }
  else {
    pDVar10 = DynamicObject::GetDynamicType(pDStack_20);
    bVar5 = DynamicType::GetIsShared(pDVar10);
    if ((bVar5) &&
       (bVar5 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler), !bVar5)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x327,
                                  "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                  "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pDVar4 = pDStack_20;
    uVar3 = value_local._4_4_;
    propertyIndex = value_local._2_2_;
    iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
    BVar7 = SetAttributesHelper(this,pDVar4,uVar3,propertyIndex,
                                (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar8),
                                newTypeHandler._7_1_,true);
    scriptContext._7_1_ = BVar7 != 0;
    if ((bool)scriptContext._7_1_) {
      pDVar10 = DynamicObject::GetDynamicType(pDStack_20);
      pDVar11 = DynamicType::GetTypeHandler(pDVar10);
      pPStack_40 = FromTypeHandler(pDVar11);
      SetSlotAndCache(pPStack_40,pDStack_20,value_local._4_4_,(PropertyRecord *)0x0,
                      value_local._2_2_,pvStack_30,info,flags,possibleSideEffects);
      this_local._4_4_ = 1;
    }
    else {
      pDVar11 = DynamicObject::GetTypeHandler(pDStack_20);
      this_local._4_4_ =
           (*pDVar11->_vptr_DynamicTypeHandler[0x3a])
                     (pDVar11,pDStack_20,(ulong)value_local._4_4_,pvStack_30,
                      (ulong)newTypeHandler._7_1_,info,CONCAT44(uVar12,flags),
                      (uint)possibleSideEffects);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }